

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

SHOP_DATA * new_shop(void)

{
  SHOP_DATA *pSVar1;
  uint clearmem;
  SHOP_DATA *pShop;
  uint local_c;
  
  pSVar1 = (SHOP_DATA *)operator_new(0x20);
  for (local_c = 0; local_c < 0x20; local_c = local_c + 1) {
    (&pSVar1->fIsPetShop)[local_c] = false;
  }
  pSVar1->open_hour = 0;
  pSVar1->close_hour = 0x17;
  pSVar1->direction = 0;
  return pSVar1;
}

Assistant:

SHOP_DATA *new_shop(void)
{
	SHOP_DATA *pShop = new SHOP_DATA;

	CLEAR_MEM(pShop, sizeof(SHOP_DATA))

	pShop->open_hour = 0;
	pShop->close_hour = 23;
	pShop->direction = 0;

	return pShop;
}